

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::BeginFrameObserverState::~BeginFrameObserverState
          (BeginFrameObserverState *this)

{
  BeginFrameObserverState *this_local;
  
  ~BeginFrameObserverState(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

BeginFrameObserverState::~BeginFrameObserverState() = default;